

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

PackageSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::PackageSymbol,slang::ast::Compilation&,char_const(&)[4],slang::SourceLocation_const&,slang::ast::NetType_const&,slang::ast::VariableLifetime>
          (BumpAllocator *this,Compilation *args,char (*args_1) [4],SourceLocation *args_2,
          NetType *args_3,VariableLifetime *args_4)

{
  string_view name;
  PackageSymbol *this_00;
  char *in_RCX;
  char *in_RSI;
  size_t in_R8;
  SourceLocation in_R9;
  size_t in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  BumpAllocator *in_stack_ffffffffffffffb8;
  Compilation *in_stack_ffffffffffffffc0;
  PackageSymbol *in_stack_ffffffffffffffc8;
  
  this_00 = (PackageSymbol *)
            allocate(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this_00,in_RSI);
  name._M_str = in_RCX;
  name._M_len = in_R8;
  ast::PackageSymbol::PackageSymbol
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,name,in_R9,*(NetType **)in_RCX,
             (VariableLifetime)in_RSI);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }